

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blobs.cpp
# Opt level: O2

void local_sum(Block *b,ProxyWithLink *cp)

{
  result_type_conflict *prVar1;
  Link *pLVar2;
  pointer pBVar3;
  pointer x;
  Proxy *pPVar4;
  int64_t iVar5;
  ProxyWithLink *this;
  result_type_conflict rVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  long *v;
  result_type_conflict *prVar9;
  long lVar10;
  int i;
  long lVar11;
  vector<long,_std::allocator<long>_> *__range1;
  int64_t sum;
  ProxyWithLink *local_50;
  default_random_engine generator;
  uniform_int_distribution<long> distribution;
  
  uVar8 = (ulong)(long)(cp->super_Proxy).gid_ % 0x7fffffff;
  generator._M_x = uVar8 + (uVar8 == 0);
  sum = 0;
  distribution._M_param._M_a = -9;
  distribution._M_param._M_b = 9;
  prVar1 = (b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50 = cp;
  for (prVar9 = (b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start; this = local_50, iVar5 = sum, prVar9 != prVar1;
      prVar9 = prVar9 + 1) {
    rVar6 = std::uniform_int_distribution<long>::operator()(&distribution,&generator);
    *prVar9 = rVar6;
    sum = iVar5 + rVar6;
  }
  pLVar2 = local_50->link_;
  pPVar4 = &local_50->super_Proxy;
  lVar10 = 0;
  for (lVar11 = 0;
      pBVar3 = (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar11 < (int)((ulong)((long)(pLVar2->neighbors_).
                                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3);
      lVar11 = lVar11 + 1) {
    x = (b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
    diy::Master::Proxy::enqueue_blob
              (&this->super_Proxy,(BlockID *)((long)&pBVar3->gid + lVar10),(char *)x,
               (long)(b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)x);
    pmVar7 = Catch::clara::std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::operator[](&pPVar4->outgoing_,
                          (key_type *)
                          ((long)&((pLVar2->neighbors_).
                                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->gid + lVar10));
    (*(pmVar7->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar7,&sum,8);
    lVar10 = lVar10 + 8;
  }
  return;
}

Assistant:

void local_sum(Block* b, const diy::Master::ProxyWithLink& cp)
{
    std::default_random_engine generator(cp.gid());
    std::uniform_int_distribution<std::int64_t> distribution(-9, 9);

    std::int64_t sum = 0;
    for (auto &v : b->buffer)
    {
      v = distribution(generator);
      sum += v;
    }

    diy::Link* l = cp.link();
    for (int i = 0; i < l->size(); ++i)
    {
      cp.enqueue_blob(l->target(i), (const char*) b->buffer.data(), b->buffer.size() * sizeof(std::int64_t));
      cp.enqueue(l->target(i), sum);
    }
}